

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  bool bVar1;
  reference ppIVar2;
  IStreamingReporter *pIVar3;
  Counts *in_RDI;
  bool missingAssertions;
  Counts assertions;
  Counts *in_stack_ffffffffffffff10;
  RunContext *in_stack_ffffffffffffff18;
  undefined1 *_durationInSeconds;
  SectionInfo *in_stack_ffffffffffffff28;
  SectionStats *in_stack_ffffffffffffff30;
  undefined1 local_c8 [159];
  undefined1 local_29;
  
  Counts::operator-(in_RDI,(Counts *)in_stack_ffffffffffffff18);
  local_29 = testForMissingAssertions(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  bVar1 = std::
          vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
          ::empty((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                   *)in_RDI);
  if (!bVar1) {
    ppIVar2 = std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                      *)in_stack_ffffffffffffff10);
    (*((*ppIVar2)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[10])();
    std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::pop_back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                *)0x1b34ff);
  }
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)&in_RDI[0xd].failed);
  _durationInSeconds = local_c8;
  SectionStats::SectionStats
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_RDI,(double)_durationInSeconds,
             SUB81((ulong)pIVar3 >> 0x38,0));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,_durationInSeconds);
  SectionStats::~SectionStats((SectionStats *)0x1b3566);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x1b3577);
  return;
}

Assistant:

virtual void sectionEnded( SectionEndInfo const& endInfo ) {
            Counts assertions = m_totals.assertions - endInfo.prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( !m_activeSections.empty() ) {
                m_activeSections.back()->close();
                m_activeSections.pop_back();
            }

            m_reporter->sectionEnded( SectionStats( endInfo.sectionInfo, assertions, endInfo.durationInSeconds, missingAssertions ) );
            m_messages.clear();
        }